

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O0

void __thiscall
num_parse_test_parse_signed_limits_Test::~num_parse_test_parse_signed_limits_Test
          (num_parse_test_parse_signed_limits_Test *this)

{
  num_parse_test_parse_signed_limits_Test *this_local;
  
  ~num_parse_test_parse_signed_limits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(num_parse_test, parse_signed_limits) {
  int32_t max32 = std::numeric_limits<int32_t>::max();
  auto res32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&max32));
  EXPECT_EQ(res32, max32);

  int32_t min32 = std::numeric_limits<int32_t>::min();
  res32 = parse<int32_t, sizeof(int32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&min32));
  EXPECT_EQ(res32, min32);
}